

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O3

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::TriangleMv<4>_>::operator()
          (NodeRecord *__return_storage_ptr__,CreateMortonLeaf<4,_embree::TriangleMv<4>_> *this,
          range<unsigned_int> *current,CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint uVar8;
  FastAllocator *this_00;
  ThreadLocal *pTVar9;
  ThreadLocal2 *this_01;
  iterator __position;
  TriangleMesh *pTVar10;
  BuildPrim *pBVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  size_t sVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar23;
  undefined1 auVar24 [12];
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  vuint4 vgeomID;
  vuint4 vprimID;
  undefined8 local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  CreateMortonLeaf<4,_embree::TriangleMv<4>_> *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  uint local_48 [6];
  
  uVar6 = current->_begin;
  uVar7 = current->_end;
  this_00 = alloc->alloc;
  pTVar9 = alloc->talloc1;
  local_f8 = 0xb0;
  this_01 = pTVar9->parent;
  local_80 = this;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    uStack_b0 = CONCAT71(uStack_b0._1_7_,1);
    local_b8 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_e8 = &FastAllocator::s_thread_local_allocators_lock;
    uStack_e0 = CONCAT71(uStack_e0._1_7_,1);
    local_78 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,(ThreadLocal2 **)&local_78);
    }
    else {
      *__position._M_current = this_01;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if ((char)uStack_b0 == '\x01') {
      MutexSys::unlock(&local_b8->mutex);
    }
  }
  uVar15 = local_f8;
  pTVar9->bytesUsed = pTVar9->bytesUsed + local_f8;
  sVar18 = pTVar9->cur;
  uVar19 = (ulong)(-(int)sVar18 & 0xf);
  uVar16 = sVar18 + local_f8 + uVar19;
  pTVar9->cur = uVar16;
  if (pTVar9->end < uVar16) {
    pTVar9->cur = sVar18;
    uVar16 = pTVar9->allocBlockSize;
    if (local_f8 * 4 < uVar16 || local_f8 * 4 - uVar16 == 0) {
      local_e8 = (undefined8 *)uVar16;
      pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
      pTVar9->ptr = pcVar17;
      sVar18 = (pTVar9->end - pTVar9->cur) + pTVar9->bytesWasted;
      pTVar9->bytesWasted = sVar18;
      pTVar9->end = (size_t)local_e8;
      pTVar9->cur = uVar15;
      if (local_e8 < uVar15) {
        pTVar9->cur = 0;
        local_e8 = (undefined8 *)pTVar9->allocBlockSize;
        pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
        pTVar9->ptr = pcVar17;
        sVar18 = (pTVar9->end - pTVar9->cur) + pTVar9->bytesWasted;
        pTVar9->bytesWasted = sVar18;
        pTVar9->end = (size_t)local_e8;
        pTVar9->cur = uVar15;
        if (local_e8 < uVar15) {
          pTVar9->cur = 0;
          pcVar17 = (char *)0x0;
          goto LAB_00be0ca4;
        }
      }
      pTVar9->bytesWasted = sVar18;
    }
    else {
      pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)&local_f8);
    }
  }
  else {
    pTVar9->bytesWasted = pTVar9->bytesWasted + uVar19;
    pcVar17 = pTVar9->ptr + (uVar16 - local_f8);
  }
LAB_00be0ca4:
  local_f8._0_4_ = 0xffffffff;
  local_f8._4_4_ = 0xffffffff;
  uStack_f0 = 0xffffffff;
  uStack_ec = 0xffffffff;
  local_48[0] = 0xffffffff;
  local_48[1] = 0xffffffff;
  local_48[2] = 0xffffffff;
  local_48[3] = 0xffffffff;
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  uStack_50._0_4_ = 0;
  uStack_50._4_4_ = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = (undefined8 *)0x0;
  uStack_e0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = (ThreadLocal2 *)0x0;
  uStack_b0 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = (ThreadLocal2 *)0x0;
  uStack_70 = 0;
  if (uVar7 == uVar6) {
    auVar24 = DAT_01f7a9f0._0_12_;
    uStack_ec = 0xffffffff;
    local_f8._0_4_ = 0xffffffff;
    local_f8._4_4_ = 0xffffffff;
    uStack_f0 = 0xffffffff;
    local_68 = 0;
    uStack_60 = 0;
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    uStack_70._0_4_ = 0;
    uStack_70._4_4_ = 0;
    local_98._0_4_ = 0;
    local_98._4_4_ = 0;
    uStack_90._0_4_ = 0;
    uStack_90._4_4_ = 0;
    local_a8._0_4_ = 0;
    local_a8._4_4_ = 0;
    uStack_a0._0_4_ = 0;
    uStack_a0._4_4_ = 0;
    local_b8._0_4_ = 0;
    local_b8._4_4_ = 0;
    uStack_b0._0_4_ = 0;
    uStack_b0._4_4_ = 0;
    local_c8._0_4_ = 0;
    local_c8._4_4_ = 0;
    uStack_c0._0_4_ = 0;
    uStack_c0._4_4_ = 0;
    local_d8._0_4_ = 0;
    local_d8._4_4_ = 0;
    uStack_d0._0_4_ = 0;
    uStack_d0._4_4_ = 0;
    local_e8._0_4_ = 0;
    local_e8._4_4_ = 0;
    uStack_e0._0_4_ = 0;
    uStack_e0._4_4_ = 0;
    aVar23 = _DAT_01f7aa00;
    local_48[0] = 0xffffffff;
    local_48[1] = 0xffffffff;
    local_48[2] = 0xffffffff;
    local_48[3] = 0xffffffff;
  }
  else {
    iVar20 = uVar7 - uVar6;
    pTVar10 = local_80->mesh;
    pBVar11 = local_80->morton;
    lVar12 = *(long *)&(pTVar10->super_Geometry).field_0x58;
    lVar13 = *(long *)&pTVar10->field_0x68;
    pcVar14 = (pTVar10->vertices0).super_RawBufferView.ptr_ofs;
    sVar18 = (pTVar10->vertices0).super_RawBufferView.stride;
    uVar7 = local_80->geomID_;
    lVar21 = 0;
    aVar23 = _DAT_01f7aa00;
    auVar25 = _DAT_01f7a9f0;
    do {
      uVar8 = *(uint *)((long)&pBVar11[uVar6].field_0 + lVar21 * 2 + 4);
      lVar22 = (ulong)uVar8 * lVar13;
      auVar3 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar12 + lVar22) * sVar18);
      auVar4 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar12 + 4 + lVar22) * sVar18);
      auVar5 = *(undefined1 (*) [16])(pcVar14 + *(uint *)(lVar12 + 8 + lVar22) * sVar18);
      auVar25 = minps(auVar25,auVar3);
      auVar27 = minps(auVar4,auVar5);
      auVar25 = minps(auVar25,auVar27);
      auVar24 = auVar25._0_12_;
      auVar27 = maxps((undefined1  [16])aVar23,auVar3);
      auVar28 = maxps(auVar4,auVar5);
      aVar23 = (anon_union_16_2_47237d3f_for_Vec3fx_0)maxps(auVar27,auVar28);
      *(uint *)((long)&local_f8 + lVar21) = uVar7;
      *(uint *)((long)local_48 + lVar21) = uVar8;
      *(int *)((long)&local_e8 + lVar21) = auVar3._0_4_;
      *(int *)((long)&local_d8 + lVar21) = auVar3._4_4_;
      *(int *)((long)&local_c8 + lVar21) = auVar3._8_4_;
      *(int *)((long)&local_b8 + lVar21) = auVar4._0_4_;
      *(int *)((long)&local_a8 + lVar21) = auVar4._4_4_;
      *(int *)((long)&local_98 + lVar21) = auVar4._8_4_;
      *(int *)((long)&local_78 + lVar21) = auVar5._0_4_;
      *(int *)((long)&local_68 + lVar21) = auVar5._4_4_;
      *(int *)((long)&local_58 + lVar21) = auVar5._8_4_;
      lVar21 = lVar21 + 4;
    } while ((ulong)(iVar20 + (uint)(iVar20 == 0)) << 2 != lVar21);
  }
  *(undefined4 *)pcVar17 = (undefined4)local_e8;
  *(undefined4 *)(pcVar17 + 4) = local_e8._4_4_;
  *(undefined4 *)(pcVar17 + 8) = (undefined4)uStack_e0;
  *(undefined4 *)(pcVar17 + 0xc) = uStack_e0._4_4_;
  *(undefined4 *)(pcVar17 + 0x10) = (undefined4)local_d8;
  *(undefined4 *)(pcVar17 + 0x14) = local_d8._4_4_;
  *(undefined4 *)(pcVar17 + 0x18) = (undefined4)uStack_d0;
  *(undefined4 *)(pcVar17 + 0x1c) = uStack_d0._4_4_;
  *(undefined4 *)(pcVar17 + 0x20) = (undefined4)local_c8;
  *(undefined4 *)(pcVar17 + 0x24) = local_c8._4_4_;
  *(undefined4 *)(pcVar17 + 0x28) = (undefined4)uStack_c0;
  *(undefined4 *)(pcVar17 + 0x2c) = uStack_c0._4_4_;
  *(undefined4 *)(pcVar17 + 0x30) = (undefined4)local_b8;
  *(undefined4 *)(pcVar17 + 0x34) = local_b8._4_4_;
  *(undefined4 *)(pcVar17 + 0x38) = (undefined4)uStack_b0;
  *(undefined4 *)(pcVar17 + 0x3c) = uStack_b0._4_4_;
  *(undefined4 *)(pcVar17 + 0x40) = (undefined4)local_a8;
  *(undefined4 *)(pcVar17 + 0x44) = local_a8._4_4_;
  *(undefined4 *)(pcVar17 + 0x48) = (undefined4)uStack_a0;
  *(undefined4 *)(pcVar17 + 0x4c) = uStack_a0._4_4_;
  *(undefined4 *)(pcVar17 + 0x50) = (undefined4)local_98;
  *(undefined4 *)(pcVar17 + 0x54) = local_98._4_4_;
  *(undefined4 *)(pcVar17 + 0x58) = (undefined4)uStack_90;
  *(undefined4 *)(pcVar17 + 0x5c) = uStack_90._4_4_;
  *(undefined4 *)(pcVar17 + 0x60) = (undefined4)local_78;
  *(undefined4 *)(pcVar17 + 100) = local_78._4_4_;
  *(undefined4 *)(pcVar17 + 0x68) = (undefined4)uStack_70;
  *(undefined4 *)(pcVar17 + 0x6c) = uStack_70._4_4_;
  *(undefined8 *)(pcVar17 + 0x70) = local_68;
  *(undefined8 *)(pcVar17 + 0x78) = uStack_60;
  *(undefined4 *)(pcVar17 + 0x80) = (undefined4)local_58;
  *(undefined4 *)(pcVar17 + 0x84) = local_58._4_4_;
  *(undefined4 *)(pcVar17 + 0x88) = (undefined4)uStack_50;
  *(undefined4 *)(pcVar17 + 0x8c) = uStack_50._4_4_;
  *(undefined4 *)(pcVar17 + 0x90) = (undefined4)local_f8;
  *(undefined4 *)(pcVar17 + 0x94) = local_f8._4_4_;
  *(undefined4 *)(pcVar17 + 0x98) = uStack_f0;
  *(undefined4 *)(pcVar17 + 0x9c) = uStack_ec;
  *(uint *)(pcVar17 + 0xa0) = local_48[0];
  *(uint *)(pcVar17 + 0xa4) = local_48[1];
  *(uint *)(pcVar17 + 0xa8) = local_48[2];
  *(uint *)(pcVar17 + 0xac) = local_48[3];
  aVar26.m128[3] = (float)(current->_end - current->_begin);
  aVar26._0_12_ = auVar24;
  (__return_storage_ptr__->ref).ptr = (ulong)pcVar17 | 9;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar26;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar23;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items<=4);
        
        /* allocate leaf node */
        Triangle4v* accel = (Triangle4v*) alloc.malloc1(sizeof(Triangle4v),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,1);       
        vuint4 vgeomID = -1, vprimID = -1;
        Vec3vf4 v0 = zero, v1 = zero, v2 = zero;
        const TriangleMesh* __restrict__ mesh = this->mesh;

        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          const TriangleMesh::Triangle& tri = mesh->triangle(primID);
          const Vec3fa& p0 = mesh->vertex(tri.v[0]);
          const Vec3fa& p1 = mesh->vertex(tri.v[1]);
          const Vec3fa& p2 = mesh->vertex(tri.v[2]);
          lower = min(lower,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          upper = max(upper,(vfloat4)p0,(vfloat4)p1,(vfloat4)p2);
          vgeomID [i] = geomID_;
          vprimID [i] = primID;
          v0.x[i] = p0.x; v0.y[i] = p0.y; v0.z[i] = p0.z;
          v1.x[i] = p1.x; v1.y[i] = p1.y; v1.z[i] = p1.z;
          v2.x[i] = p2.x; v2.y[i] = p2.y; v2.z[i] = p2.z;
        }
        Triangle4v::store_nt(accel,Triangle4v(v0,v1,v2,vgeomID,vprimID));
        BBox3fx box_o = BBox3fx((Vec3fx)lower,(Vec3fx)upper);
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }